

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocketaddress_test.cpp
# Opt level: O2

pint p_test_case_psocketaddress_nomem_test(void)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long unaff_R13;
  PMemVTable vtable;
  
  p_test_module_fail_counter = 0;
  p_libsys_init();
  lVar2 = p_socket_address_new("192.168.0.1",0x422);
  if (lVar2 == 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0x38);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar3 = p_socket_address_get_native_size(lVar2);
  if (lVar3 == 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0x3b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar4 = p_malloc0(lVar3);
  if (lVar4 == 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0x3e);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_address_to_native(lVar2,lVar4,lVar3 + -1);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0x40);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_address_to_native(lVar2,lVar4,lVar3);
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0x41);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_socket_address_free(lVar2);
  iVar1 = p_socket_address_is_ipv6_supported();
  if (iVar1 != 0) {
    lVar5 = p_socket_address_new("2001:cdba:345f:24ab:fe45:5423:3257:9652",0x422);
    if (lVar5 == 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0x4a);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    lVar2 = p_socket_address_get_native_size(lVar5);
    if (lVar2 == 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0x4d);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    unaff_R13 = p_malloc0(lVar2);
    if (unaff_R13 == 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0x50);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    iVar1 = p_socket_address_to_native(lVar5,unaff_R13,lVar2 + -1);
    if (iVar1 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0x52);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    iVar1 = p_socket_address_to_native(lVar5,unaff_R13,lVar2);
    if (iVar1 != 1) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0x53);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    p_socket_address_free(lVar5);
  }
  iVar1 = p_mem_set_vtable();
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0x5d);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar5 = p_socket_address_new("192.168.0.1",0x422);
  if (lVar5 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0x5f);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar5 = p_socket_address_new_any(2,0x422);
  if (lVar5 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0x60);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar5 = p_socket_address_new_loopback(2,0x422);
  if (lVar5 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0x61);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar5 = p_socket_address_new_from_native(lVar4,lVar3);
  if (lVar5 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0x62);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_address_is_ipv6_supported();
  if (iVar1 != 0) {
    lVar5 = p_socket_address_new_from_native(unaff_R13,lVar2);
    if (lVar5 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0x65);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
  }
  p_mem_restore_vtable();
  lVar3 = p_socket_address_new_from_native(lVar4,lVar3 + -1);
  if (lVar3 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0x69);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_address_is_ipv6_supported();
  if (iVar1 != 0) {
    lVar2 = p_socket_address_new_from_native(unaff_R13,lVar2 + -1);
    if (lVar2 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0x6c);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    p_free(unaff_R13);
  }
  p_free(lVar4);
  p_libsys_shutdown();
  return -(uint)(p_test_module_fail_counter != 0);
}

Assistant:

P_TEST_CASE_BEGIN (psocketaddress_nomem_test)
{
	p_libsys_init ();

	PSocketAddress *sock_addr = p_socket_address_new ("192.168.0.1", 1058);
	P_TEST_CHECK (sock_addr != NULL);

	psize native_size = p_socket_address_get_native_size (sock_addr);
	P_TEST_CHECK (native_size > 0);

	ppointer addr_buf = p_malloc0 (native_size);
	P_TEST_CHECK (addr_buf != NULL);

	P_TEST_CHECK (p_socket_address_to_native (sock_addr, addr_buf, native_size - 1) == FALSE);
	P_TEST_CHECK (p_socket_address_to_native (sock_addr, addr_buf, native_size) == TRUE);
	p_socket_address_free (sock_addr);

	PSocketAddress *sock_addr6;
	psize native_size6;
	ppointer addr_buf6;

	if (p_socket_address_is_ipv6_supported ()) {
		sock_addr6 = p_socket_address_new ("2001:cdba:345f:24ab:fe45:5423:3257:9652", 1058);
		P_TEST_CHECK (sock_addr6 != NULL);

		native_size6 = p_socket_address_get_native_size (sock_addr6);
		P_TEST_CHECK (native_size6 > 0);

		addr_buf6 = p_malloc0 (native_size6);
		P_TEST_CHECK (addr_buf6 != NULL);

		P_TEST_CHECK (p_socket_address_to_native (sock_addr6, addr_buf6, native_size6 - 1) == FALSE);
		P_TEST_CHECK (p_socket_address_to_native (sock_addr6, addr_buf6, native_size6) == TRUE);
		p_socket_address_free (sock_addr6);
	}

	PMemVTable vtable;

	vtable.f_free    = pmem_free;
	vtable.f_malloc  = pmem_alloc;
	vtable.f_realloc = pmem_realloc;

	P_TEST_CHECK (p_mem_set_vtable (&vtable) == TRUE);

	P_TEST_CHECK (p_socket_address_new ("192.168.0.1", 1058) == NULL);
	P_TEST_CHECK (p_socket_address_new_any (P_SOCKET_FAMILY_INET, 1058) == NULL);
	P_TEST_CHECK (p_socket_address_new_loopback (P_SOCKET_FAMILY_INET, 1058) == NULL);
	P_TEST_CHECK (p_socket_address_new_from_native (addr_buf, native_size) == NULL);

	if (p_socket_address_is_ipv6_supported ())
		P_TEST_CHECK (p_socket_address_new_from_native (addr_buf6, native_size6) == NULL);

	p_mem_restore_vtable ();

	P_TEST_CHECK (p_socket_address_new_from_native (addr_buf, native_size - 1) == NULL);

	if (p_socket_address_is_ipv6_supported ()) {
		P_TEST_CHECK (p_socket_address_new_from_native (addr_buf6, native_size6 - 1) == NULL);
		p_free (addr_buf6);
	}

	p_free (addr_buf);

	p_libsys_shutdown ();
}